

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O0

void __thiscall
fasttext::QuantMatrix::QuantMatrix(QuantMatrix *this,DenseMatrix *mat,int32_t dsub,bool qnorm)

{
  int64_t iVar1;
  int64_t n;
  QuantMatrix *this_00;
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_> *this_01;
  pointer __p;
  byte in_CL;
  int in_EDX;
  Matrix *in_RDI;
  pointer in_stack_ffffffffffffff68;
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  *in_stack_ffffffffffffff70;
  Matrix *in_stack_ffffffffffffff78;
  Matrix *__new_size;
  int64_t *this_02;
  int64_t *piVar2;
  ProductQuantizer *this_03;
  DenseMatrix *mat_00;
  
  iVar1 = Matrix::size(in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70);
  n = Matrix::size(in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70);
  Matrix::Matrix(in_RDI,iVar1,n);
  in_RDI->_vptr_Matrix = (_func_int **)&PTR__QuantMatrix_001d9c10;
  __new_size = in_RDI + 1;
  std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
  unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>(in_stack_ffffffffffffff70);
  this_02 = &in_RDI[1].m_;
  std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
  unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>(in_stack_ffffffffffffff70);
  piVar2 = &in_RDI[1].n_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1b1238);
  this_03 = (ProductQuantizer *)&in_RDI[2].n_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1b124b);
  *(byte *)&in_RDI[3].n_ = in_CL & 1;
  mat_00 = (DenseMatrix *)((long)&in_RDI[3].n_ + 4);
  this_00 = (QuantMatrix *)
            Matrix::size(in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70);
  iVar1 = Matrix::size(in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70);
  *(int *)&(mat_00->super_Matrix)._vptr_Matrix =
       (int)this_00 * (int)((iVar1 + -1 + (long)in_EDX) / (long)in_EDX);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02,(size_type)__new_size)
  ;
  this_01 = (unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             *)operator_new(0x50);
  ProductQuantizer::ProductQuantizer(this_03,(int32_t)((ulong)piVar2 >> 0x20),(int32_t)piVar2);
  std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
  unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>
            (this_01,in_stack_ffffffffffffff68);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  operator=(this_01,(unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                     *)in_stack_ffffffffffffff68);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  ~unique_ptr(this_01);
  if ((in_RDI[3].n_ & 1) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02,
               (size_type)__new_size);
    __p = (pointer)operator_new(0x50);
    ProductQuantizer::ProductQuantizer(this_03,(int32_t)((ulong)piVar2 >> 0x20),(int32_t)piVar2);
    std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
    unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>(this_01,__p);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    operator=(this_01,(unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                       *)__p);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    ~unique_ptr(this_01);
  }
  quantize(this_00,mat_00);
  return;
}

Assistant:

QuantMatrix::QuantMatrix(DenseMatrix&& mat, int32_t dsub, bool qnorm)
    : Matrix(mat.size(0), mat.size(1)),
      qnorm_(qnorm),
      codesize_(mat.size(0) * ((mat.size(1) + dsub - 1) / dsub)) {
  codes_.resize(codesize_);
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(n_, dsub));
  if (qnorm_) {
    norm_codes_.resize(m_);
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(1, 1));
  }
  quantize(std::forward<DenseMatrix>(mat));
}